

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O2

void Assimp::LogFunctions<Assimp::FBXImporter>::LogDebug(format *message)

{
  bool bVar1;
  Logger *this;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    this = DefaultLogger::get();
    __lhs = Prefix();
    std::__cxx11::stringbuf::str();
    std::operator+(&local_60,__lhs,&local_40);
    Logger::debug(this,local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

static void LogDebug(const Formatter::format& message)  {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_DEBUG(Prefix()+(std::string)message);
        }
    }